

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_header.hpp
# Opt level: O0

void pstore::serialize::serializer<pstore::extent<pstore::repo::fragment>,void>::
     read<pstore::serialize::archive::database_reader&>(database_reader *archive,value_type *r)

{
  unsigned_long uVar1;
  typed_address<pstore::repo::fragment> a;
  unsigned_long size;
  typed_address<pstore::repo::fragment> addr;
  value_type *r_local;
  database_reader *archive_local;
  
  uVar1 = read<unsigned_long,pstore::serialize::archive::database_reader&>(archive);
  a = typed_address<pstore::repo::fragment>::make(uVar1);
  uVar1 = read<unsigned_long,pstore::serialize::archive::database_reader&>(archive);
  extent<pstore::repo::fragment>::extent(r,a,uVar1);
  return;
}

Assistant:

static void read (Archive && archive, value_type & r) {
                auto const addr = typed_address<T>::make (serialize::read<std::uint64_t> (archive));
                auto const size = serialize::read<std::uint64_t> (archive);
                new (&r) extent<T> (addr, size);
            }